

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_clock.c
# Opt level: O3

void mk_clock_headers_preset(time_t utime,mk_server *server)

{
  mk_clock_context *pmVar1;
  int iVar2;
  tm *__tp;
  size_t sVar3;
  char *__s;
  tm result;
  time_t local_60;
  tm local_58;
  
  pmVar1 = server->clock_context;
  __s = pmVar1->header_time_buffers[0];
  if (__s == (pmVar1->headers_preset).data) {
    __s = pmVar1->header_time_buffers[1];
  }
  local_60 = utime;
  __tp = gmtime_r(&local_60,&local_58);
  iVar2 = snprintf(__s,0x40,"%s",server->server_signature_header);
  sVar3 = strftime(__s + iVar2,(long)(0x80 - iVar2),"Date: %a, %d %b %Y %H:%M:%S GMT\r\n",__tp);
  pmVar1 = server->clock_context;
  (pmVar1->headers_preset).data = __s;
  (pmVar1->headers_preset).len = (long)((int)sVar3 + iVar2);
  return;
}

Assistant:

static void mk_clock_headers_preset(time_t utime, struct mk_server *server)
{
    int len1;
    int len2;
    struct tm *gmt_tm;
    struct tm result;
    char *buffer;

    buffer = _next_buffer(&server->clock_context->headers_preset,
                          server->clock_context->header_time_buffers);

    gmt_tm = gmtime_r(&utime, &result);

    len1 = snprintf(buffer,
                    HEADER_TIME_BUFFER_SIZE,
                    "%s",
                    server->server_signature_header);

    len2 = strftime(buffer + len1,
                    HEADER_PRESET_SIZE - len1,
                    MK_CLOCK_GMT_DATEFORMAT,
                    gmt_tm);

    server->clock_context->headers_preset.data = buffer;
    server->clock_context->headers_preset.len  = len1 + len2;
}